

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyNormalizeSpaces(Lexer *lexer,Node *node)

{
  Bool BVar1;
  uint uVar2;
  tmbstr local_28;
  tmbstr p;
  uint c;
  uint i;
  Node *node_local;
  Lexer *lexer_local;
  
  node_local = (Node *)lexer;
  for (_c = node; _c != (Node *)0x0; _c = _c->next) {
    if (_c->content != (Node *)0x0) {
      prvTidyNormalizeSpaces((Lexer *)node_local,_c->content);
    }
    BVar1 = prvTidynodeIsText(_c);
    if (BVar1 != no) {
      local_28 = (tmbstr)((long)&(node_local[1].parent)->parent + (ulong)_c->start);
      for (p._4_4_ = _c->start; p._4_4_ < _c->end; p._4_4_ = p._4_4_ + 1) {
        p._0_4_ = (uint)*(byte *)((long)&(node_local[1].parent)->parent + (ulong)p._4_4_);
        if (0x7f < (uint)p) {
          uVar2 = prvTidyGetUTF8((ctmbstr)((long)&(node_local[1].parent)->parent + (ulong)p._4_4_),
                                 (uint *)&p);
          p._4_4_ = uVar2 + p._4_4_;
        }
        if ((uint)p == 0xa0) {
          p._0_4_ = 0x20;
        }
        local_28 = prvTidyPutUTF8(local_28,(uint)p);
      }
      _c->end = (int)local_28 - (int)node_local[1].parent;
    }
  }
  return;
}

Assistant:

void TY_(NormalizeSpaces)(Lexer *lexer, Node *node)
{
    while ( node )
    {
        if ( node->content )
            TY_(NormalizeSpaces)( lexer, node->content );

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (byte) lexer->lexbuf[i];

                /* look for UTF-8 multibyte character */
                if ( c > 0x7F )
                    i += TY_(GetUTF8)( lexer->lexbuf + i, &c );

                if ( c == 160 )
                    c = ' ';

                p = TY_(PutUTF8)(p, c);
            }
            node->end = p - lexer->lexbuf;
        }

        node = node->next;
    }
}